

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

ssize_t sftp_readdir(LIBSSH2_SFTP_HANDLE *handle,char *buffer,size_t buffer_maxlen,char *longentry,
                    size_t longentry_maxlen,LIBSSH2_SFTP_ATTRIBUTES *attrs)

{
  uint32_t uVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  LIBSSH2_SFTP_ATTRIBUTES *__n;
  LIBSSH2_SFTP_ATTRIBUTES *pLVar5;
  ssize_t sVar6;
  LIBSSH2_SFTP *local_f8;
  uint rerrno;
  ssize_t attr_len;
  size_t names_packet_len;
  size_t longentry_len;
  size_t filename_len;
  size_t real_filename_len;
  size_t real_longentry_len;
  LIBSSH2_SFTP_ATTRIBUTES attrs_dummy;
  ssize_t retcode;
  uchar *data;
  uchar *s;
  uint32_t packet_len;
  uint32_t num_names;
  size_t data_len;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SFTP *sftp;
  LIBSSH2_SFTP_ATTRIBUTES *attrs_local;
  size_t longentry_maxlen_local;
  char *longentry_local;
  size_t buffer_maxlen_local;
  char *buffer_local;
  LIBSSH2_SFTP_HANDLE *handle_local;
  
  channel = (LIBSSH2_CHANNEL *)handle->sftp;
  session = (LIBSSH2_SESSION *)(channel->node).next;
  data_len = (size_t)session->kex_prefs;
  _packet_len = 0;
  s._0_4_ = (int)handle->handle_len + 0xd;
  sftp = (LIBSSH2_SFTP *)attrs;
  attrs_local = (LIBSSH2_SFTP_ATTRIBUTES *)longentry_maxlen;
  longentry_maxlen_local = (size_t)longentry;
  longentry_local = (char *)buffer_maxlen;
  buffer_maxlen_local = (size_t)buffer;
  buffer_local = (char *)handle;
  if (*(libssh2_nonblocking_states *)(channel->reqPTY_packet + 0x10) == libssh2_NB_state_idle) {
    *(uint32_t *)&(channel->local).close = 0;
    if ((handle->u).dir.names_left != 0) {
      uVar4 = (handle->u).dir.names_packet_len;
      if (uVar4 < 4) {
        longentry_len = 0xffffffffffffffda;
      }
      else {
        data = (uchar *)(handle->u).dir.next_name;
        uVar1 = _libssh2_ntohu32(data);
        longentry_len = (size_t)uVar1;
        data = data + 4;
        pcVar3 = (char *)(uVar4 - 4);
        if (longentry_len < longentry_local) {
          if ((longentry_local < longentry_len) || (pcVar3 < longentry_len)) {
            longentry_len = 0xffffffffffffffda;
          }
          else {
            memcpy((void *)buffer_maxlen_local,data,longentry_len);
            *(char *)(longentry_len + buffer_maxlen_local) = '\0';
            data = (uchar *)(longentry_len + (long)data);
            uVar4 = (long)pcVar3 - longentry_len;
            if (uVar4 < 4) {
              longentry_len = 0xffffffffffffffda;
            }
            else {
              uVar1 = _libssh2_ntohu32(data);
              __n = (LIBSSH2_SFTP_ATTRIBUTES *)(ulong)uVar1;
              data = data + 4;
              pLVar5 = (LIBSSH2_SFTP_ATTRIBUTES *)(uVar4 - 4);
              if ((longentry_maxlen_local != 0) && ((LIBSSH2_SFTP_ATTRIBUTES *)0x1 < attrs_local)) {
                if ((attrs_local <= __n) || (pLVar5 < __n)) {
                  return -0x26;
                }
                memcpy((void *)longentry_maxlen_local,data,(size_t)__n);
                *(undefined1 *)((long)&__n->flags + longentry_maxlen_local) = 0;
              }
              if (pLVar5 < __n) {
                longentry_len = 0xffffffffffffffda;
              }
              else {
                data = data + (long)&__n->flags;
                if (sftp != (LIBSSH2_SFTP *)0x0) {
                  memset(sftp,0,0x38);
                }
                if (sftp == (LIBSSH2_SFTP *)0x0) {
                  local_f8 = (LIBSSH2_SFTP *)&real_longentry_len;
                }
                else {
                  local_f8 = sftp;
                }
                sVar6 = sftp_bin2attr((LIBSSH2_SFTP_ATTRIBUTES *)local_f8,data,
                                      (long)pLVar5 - (long)__n);
                if (sVar6 < 0) {
                  longentry_len = 0xffffffffffffffda;
                }
                else {
                  data = data + sVar6;
                  *(uchar **)(buffer_local + 0x140) = data;
                  *(long *)(buffer_local + 0x148) = ((long)pLVar5 - (long)__n) - sVar6;
                  iVar2 = *(int *)(buffer_local + 0x130);
                  *(int *)(buffer_local + 0x130) = iVar2 + -1;
                  if (iVar2 + -1 == 0) {
                    (**(code **)(data_len + 0x18))(*(undefined8 *)(buffer_local + 0x138),data_len);
                  }
                }
              }
            }
          }
        }
        else {
          longentry_len = 0xffffffffffffffda;
        }
      }
      return longentry_len;
    }
    data = (uchar *)(*((LIBSSH2_SESSION *)data_len)->alloc)((size_t)(uint)s,(void **)data_len);
    *(uchar **)(channel->reqPTY_packet + 0x14) = data;
    if (*(long *)(channel->reqPTY_packet + 0x14) == 0) {
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)data_len,-6,
                             "Unable to allocate memory for FXP_READDIR packet");
      return (long)iVar2;
    }
    _libssh2_store_u32(&data,(uint)s - 4);
    *data = '\f';
    iVar2 = *(int *)&(channel->node).prev;
    *(int *)&(channel->node).prev = iVar2 + 1;
    *(int *)(channel->reqPTY_packet + 0x1c) = iVar2;
    data = data + 1;
    _libssh2_store_u32(&data,*(uint32_t *)(channel->reqPTY_packet + 0x1c));
    _libssh2_store_str(&data,buffer_local + 0x20,*(size_t *)(buffer_local + 0x120));
    channel->reqPTY_packet[0x10] = '\x02';
    channel->reqPTY_packet[0x11] = '\0';
    channel->reqPTY_packet[0x12] = '\0';
    channel->reqPTY_packet[0x13] = '\0';
  }
  if (*(int *)(channel->reqPTY_packet + 0x10) == 2) {
    attrs_dummy.mtime =
         _libssh2_channel_write
                   ((LIBSSH2_CHANNEL *)session,0,*(uchar **)(channel->reqPTY_packet + 0x14),
                    (ulong)(uint)s);
    if (attrs_dummy.mtime == 0xffffffffffffffdb) {
      return -0x25;
    }
    if ((uint)s != attrs_dummy.mtime) {
      (**(code **)(data_len + 0x18))(*(undefined8 *)(channel->reqPTY_packet + 0x14),data_len);
      channel->reqPTY_packet[0x14] = '\0';
      channel->reqPTY_packet[0x15] = '\0';
      channel->reqPTY_packet[0x16] = '\0';
      channel->reqPTY_packet[0x17] = '\0';
      channel->reqPTY_packet[0x18] = '\0';
      channel->reqPTY_packet[0x19] = '\0';
      channel->reqPTY_packet[0x1a] = '\0';
      channel->reqPTY_packet[0x1b] = '\0';
      channel->reqPTY_packet[0x10] = '\0';
      channel->reqPTY_packet[0x11] = '\0';
      channel->reqPTY_packet[0x12] = '\0';
      channel->reqPTY_packet[0x13] = '\0';
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)data_len,-7,"_libssh2_channel_write() failed");
      return (long)iVar2;
    }
    (**(code **)(data_len + 0x18))(*(undefined8 *)(channel->reqPTY_packet + 0x14),data_len);
    channel->reqPTY_packet[0x14] = '\0';
    channel->reqPTY_packet[0x15] = '\0';
    channel->reqPTY_packet[0x16] = '\0';
    channel->reqPTY_packet[0x17] = '\0';
    channel->reqPTY_packet[0x18] = '\0';
    channel->reqPTY_packet[0x19] = '\0';
    channel->reqPTY_packet[0x1a] = '\0';
    channel->reqPTY_packet[0x1b] = '\0';
    channel->reqPTY_packet[0x10] = '\x03';
    channel->reqPTY_packet[0x11] = '\0';
    channel->reqPTY_packet[0x12] = '\0';
    channel->reqPTY_packet[0x13] = '\0';
  }
  iVar2 = sftp_packet_requirev
                    ((LIBSSH2_SFTP *)channel,2,"he",*(uint32_t *)(channel->reqPTY_packet + 0x1c),
                     (uchar **)&retcode,(size_t *)&packet_len,9);
  attrs_dummy.mtime = (unsigned_long)iVar2;
  if (attrs_dummy.mtime == 0xffffffffffffffdb) {
    handle_local = (LIBSSH2_SFTP_HANDLE *)0xffffffffffffffdb;
  }
  else if (attrs_dummy.mtime == 0xffffffffffffffda) {
    if (_packet_len != 0) {
      (**(code **)(data_len + 0x18))(retcode,data_len);
    }
    iVar2 = _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"Status message too short");
    handle_local = (LIBSSH2_SFTP_HANDLE *)(long)iVar2;
  }
  else if (attrs_dummy.mtime == 0) {
    if (*(char *)retcode == 'e') {
      uVar1 = _libssh2_ntohu32((uchar *)(retcode + 5));
      (**(code **)(data_len + 0x18))(retcode,data_len);
      if (uVar1 == 1) {
        channel->reqPTY_packet[0x10] = '\0';
        channel->reqPTY_packet[0x11] = '\0';
        channel->reqPTY_packet[0x12] = '\0';
        channel->reqPTY_packet[0x13] = '\0';
        handle_local = (LIBSSH2_SFTP_HANDLE *)0x0;
      }
      else {
        (channel->local).close = (char)uVar1;
        (channel->local).eof = (char)(uVar1 >> 8);
        (channel->local).extended_data_ignore_mode = (char)(uVar1 >> 0x10);
        (channel->local).field_0x13 = (char)(uVar1 >> 0x18);
        channel->reqPTY_packet[0x10] = '\0';
        channel->reqPTY_packet[0x11] = '\0';
        channel->reqPTY_packet[0x12] = '\0';
        channel->reqPTY_packet[0x13] = '\0';
        iVar2 = _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP Protocol Error");
        handle_local = (LIBSSH2_SFTP_HANDLE *)(long)iVar2;
      }
    }
    else {
      channel->reqPTY_packet[0x10] = '\0';
      channel->reqPTY_packet[0x11] = '\0';
      channel->reqPTY_packet[0x12] = '\0';
      channel->reqPTY_packet[0x13] = '\0';
      s._4_4_ = _libssh2_ntohu32((uchar *)(retcode + 5));
      if (s._4_4_ == 0) {
        (**(code **)(data_len + 0x18))(retcode,data_len);
        handle_local = (LIBSSH2_SFTP_HANDLE *)0x0;
      }
      else {
        *(uint32_t *)(buffer_local + 0x130) = s._4_4_;
        *(ssize_t *)(buffer_local + 0x138) = retcode;
        *(ssize_t *)(buffer_local + 0x140) = retcode + 9;
        *(size_t *)(buffer_local + 0x148) = _packet_len - 9;
        handle_local = (LIBSSH2_SFTP_HANDLE *)
                       sftp_readdir((LIBSSH2_SFTP_HANDLE *)buffer_local,(char *)buffer_maxlen_local,
                                    (size_t)longentry_local,(char *)longentry_maxlen_local,
                                    (size_t)attrs_local,(LIBSSH2_SFTP_ATTRIBUTES *)sftp);
      }
    }
  }
  else {
    channel->reqPTY_packet[0x10] = '\0';
    channel->reqPTY_packet[0x11] = '\0';
    channel->reqPTY_packet[0x12] = '\0';
    channel->reqPTY_packet[0x13] = '\0';
    iVar2 = _libssh2_error((LIBSSH2_SESSION *)data_len,iVar2,"Timeout waiting for status message");
    handle_local = (LIBSSH2_SFTP_HANDLE *)(long)iVar2;
  }
  return (ssize_t)handle_local;
}

Assistant:

static ssize_t sftp_readdir(LIBSSH2_SFTP_HANDLE *handle, char *buffer,
                            size_t buffer_maxlen, char *longentry,
                            size_t longentry_maxlen,
                            LIBSSH2_SFTP_ATTRIBUTES *attrs)
{
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t data_len = 0;
    uint32_t num_names;
    /* 13 = packet_len(4) + packet_type(1) + request_id(4) + handle_len(4) */
    uint32_t packet_len = (uint32_t)(handle->handle_len + 13);
    unsigned char *s, *data;
    static const unsigned char read_responses[2] = {
        SSH_FXP_NAME, SSH_FXP_STATUS };
    ssize_t retcode;

    if(sftp->readdir_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        if(handle->u.dir.names_left) {
            /*
             * A prior request returned more than one directory entry,
             * feed it back from the buffer
             */
            LIBSSH2_SFTP_ATTRIBUTES attrs_dummy;
            size_t real_longentry_len;
            size_t real_filename_len;
            size_t filename_len;
            size_t longentry_len;
            size_t names_packet_len = handle->u.dir.names_packet_len;
            ssize_t attr_len = 0;

            if(names_packet_len >= 4) {
                s = (unsigned char *) handle->u.dir.next_name;
                real_filename_len = _libssh2_ntohu32(s);
                s += 4;
                names_packet_len -= 4;
            }
            else {
                filename_len = (size_t)LIBSSH2_ERROR_BUFFER_TOO_SMALL;
                goto end;
            }

            filename_len = real_filename_len;
            if(filename_len >= buffer_maxlen) {
                filename_len = (size_t)LIBSSH2_ERROR_BUFFER_TOO_SMALL;
                goto end;
            }

            if(buffer_maxlen >= filename_len && names_packet_len >=
               filename_len) {
                memcpy(buffer, s, filename_len);
                buffer[filename_len] = '\0';           /* zero terminate */
                s += real_filename_len;
                names_packet_len -= real_filename_len;
            }
            else {
                filename_len = (size_t)LIBSSH2_ERROR_BUFFER_TOO_SMALL;
                goto end;
            }

            if(names_packet_len >= 4) {
                real_longentry_len = _libssh2_ntohu32(s);
                s += 4;
                names_packet_len -= 4;
            }
            else {
                filename_len = (size_t)LIBSSH2_ERROR_BUFFER_TOO_SMALL;
                goto end;
            }

            if(longentry && (longentry_maxlen > 1)) {
                longentry_len = real_longentry_len;

                if(longentry_len >= longentry_maxlen ||
                   longentry_len > names_packet_len) {
                    filename_len = (size_t)LIBSSH2_ERROR_BUFFER_TOO_SMALL;
                    goto end;
                }

                memcpy(longentry, s, longentry_len);
                longentry[longentry_len] = '\0'; /* zero terminate */
            }

            if(real_longentry_len <= names_packet_len) {
                s += real_longentry_len;
                names_packet_len -= real_longentry_len;
            }
            else {
                filename_len = (size_t)LIBSSH2_ERROR_BUFFER_TOO_SMALL;
                goto end;
            }

            if(attrs)
                memset(attrs, 0, sizeof(LIBSSH2_SFTP_ATTRIBUTES));

            attr_len = sftp_bin2attr(attrs ? attrs : &attrs_dummy, s,
                                     names_packet_len);

            if(attr_len >= 0) {
                s += attr_len;
                names_packet_len -= attr_len;
            }
            else {
                filename_len = (size_t)LIBSSH2_ERROR_BUFFER_TOO_SMALL;
                goto end;
            }

            handle->u.dir.next_name = (char *) s;
            handle->u.dir.names_packet_len = names_packet_len;

            if((--handle->u.dir.names_left) == 0)
                LIBSSH2_FREE(session, handle->u.dir.names_packet);

end:
            _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                           "libssh2_sftp_readdir_ex() return %lu",
                           (unsigned long)filename_len));
            return (ssize_t)filename_len;
        }

        /* Request another entry(entries?) */

        s = sftp->readdir_packet = LIBSSH2_ALLOC(session, packet_len);
        if(!sftp->readdir_packet)
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for "
                                  "FXP_READDIR packet");

        _libssh2_store_u32(&s, packet_len - 4);
        *(s++) = SSH_FXP_READDIR;
        sftp->readdir_request_id = sftp->request_id++;
        _libssh2_store_u32(&s, sftp->readdir_request_id);
        _libssh2_store_str(&s, handle->handle, handle->handle_len);

        sftp->readdir_state = libssh2_NB_state_created;
    }

    if(sftp->readdir_state == libssh2_NB_state_created) {
        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "Reading entries from directory handle"));
        retcode = _libssh2_channel_write(channel, 0, sftp->readdir_packet,
                                         packet_len);
        if(retcode == LIBSSH2_ERROR_EAGAIN) {
            return retcode;
        }
        else if((ssize_t)packet_len != retcode) {
            LIBSSH2_FREE(session, sftp->readdir_packet);
            sftp->readdir_packet = NULL;
            sftp->readdir_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "_libssh2_channel_write() failed");
        }

        LIBSSH2_FREE(session, sftp->readdir_packet);
        sftp->readdir_packet = NULL;

        sftp->readdir_state = libssh2_NB_state_sent;
    }

    retcode = sftp_packet_requirev(sftp, 2, read_responses,
                                   sftp->readdir_request_id, &data,
                                   &data_len, 9);
    if(retcode == LIBSSH2_ERROR_EAGAIN)
        return retcode;
    else if(retcode == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
        if(data_len > 0) {
            LIBSSH2_FREE(session, data);
        }
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "Status message too short");
    }
    else if(retcode) {
        sftp->readdir_state = libssh2_NB_state_idle;
        return _libssh2_error(session, (int)retcode,
                              "Timeout waiting for status message");
    }

    if(data[0] == SSH_FXP_STATUS) {
        unsigned int rerrno;
        rerrno = _libssh2_ntohu32(data + 5);
        LIBSSH2_FREE(session, data);
        if(rerrno == LIBSSH2_FX_EOF) {
            sftp->readdir_state = libssh2_NB_state_idle;
            return 0;
        }
        else {
            sftp->last_errno = rerrno;
            sftp->readdir_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                  "SFTP Protocol Error");
        }
    }

    sftp->readdir_state = libssh2_NB_state_idle;

    num_names = _libssh2_ntohu32(data + 5);
    _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "%u entries returned",
                   num_names));
    if(!num_names) {
        LIBSSH2_FREE(session, data);
        return 0;
    }

    handle->u.dir.names_left = num_names;
    handle->u.dir.names_packet = data;
    handle->u.dir.next_name = (char *) data + 9;
    handle->u.dir.names_packet_len = data_len - 9;

    /* use the name popping mechanism from the start of the function */
    return sftp_readdir(handle, buffer, buffer_maxlen, longentry,
                        longentry_maxlen, attrs);
}